

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

MatchMatrix * __thiscall
testing::internal::UnorderedElementsAreMatcherImpl<std::vector<int,std::allocator<int>>const&>::
AnalyzeElements<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (MatchMatrix *__return_storage_ptr__,
          UnorderedElementsAreMatcherImpl<std::vector<int,std::allocator<int>>const&> *this,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> elem_first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> elem_last,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchResultListener *listener)

{
  pointer pcVar1;
  long lVar2;
  size_t sVar3;
  size_t irhs;
  long lVar4;
  size_t num_elements;
  vector<char,_std::allocator<char>_> did_match;
  DummyMatchResultListener dummy;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(element_printouts);
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dummy.super_MatchResultListener.stream_ = (ostream *)0x0;
  dummy.super_MatchResultListener._vptr_MatchResultListener =
       (_func_int **)&PTR__MatchResultListener_00226b28;
  num_elements = 0;
  for (; elem_first._M_current != elem_last._M_current;
      elem_first._M_current = elem_first._M_current + 1) {
    if (listener->stream_ != (ostream *)0x0) {
      PrintToString<int>(&local_50,elem_first._M_current);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 element_printouts,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    lVar2 = 0;
    lVar4 = 0;
    while( true ) {
      if (lVar4 == (*(long *)(this + 0x30) - *(long *)(this + 0x28)) / 0x18) break;
      local_50._M_dataplus._M_p._0_1_ =
           MatcherBase<const_int_&>::MatchAndExplain
                     ((MatcherBase<const_int_&> *)(*(long *)(this + 0x28) + lVar2),
                      elem_first._M_current,&dummy.super_MatchResultListener);
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&did_match,(char *)&local_50);
      lVar4 = lVar4 + 1;
      lVar2 = lVar2 + 0x18;
    }
    num_elements = num_elements + 1;
  }
  MatchMatrix::MatchMatrix
            (__return_storage_ptr__,num_elements,
             (*(long *)(this + 0x30) - *(long *)(this + 0x28)) / 0x18);
  pcVar1 = did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start;
  for (sVar3 = 0; sVar3 != num_elements; sVar3 = sVar3 + 1) {
    for (lVar2 = 0; lVar2 != (*(long *)(this + 0x30) - *(long *)(this + 0x28)) / 0x18;
        lVar2 = lVar2 + 1) {
      (__return_storage_ptr__->matched_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar2 + __return_storage_ptr__->num_matchers_ * sVar3] =
           pcVar1[lVar2] != '\0';
    }
    pcVar1 = pcVar1 + lVar2;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&did_match.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

MatchMatrix AnalyzeElements(ElementIter elem_first, ElementIter elem_last,
                              ::std::vector<std::string>* element_printouts,
                              MatchResultListener* listener) const {
    element_printouts->clear();
    ::std::vector<char> did_match;
    size_t num_elements = 0;
    DummyMatchResultListener dummy;
    for (; elem_first != elem_last; ++num_elements, ++elem_first) {
      if (listener->IsInterested()) {
        element_printouts->push_back(PrintToString(*elem_first));
      }
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        did_match.push_back(
            matchers_[irhs].MatchAndExplain(*elem_first, &dummy));
      }
    }

    MatchMatrix matrix(num_elements, matchers_.size());
    ::std::vector<char>::const_iterator did_match_iter = did_match.begin();
    for (size_t ilhs = 0; ilhs != num_elements; ++ilhs) {
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        matrix.SetEdge(ilhs, irhs, *did_match_iter++ != 0);
      }
    }
    return matrix;
  }